

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O3

void __thiscall ODDLParser::OpenDDLParser::pushNode(OpenDDLParser *this,DDLNode *node)

{
  pointer *pppDVar1;
  iterator __position;
  DDLNode *local_8;
  
  if (node != (DDLNode *)0x0) {
    __position._M_current =
         (this->m_stack).
         super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_stack).
        super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_8 = node;
      std::vector<ODDLParser::DDLNode*,std::allocator<ODDLParser::DDLNode*>>::
      _M_realloc_insert<ODDLParser::DDLNode*const&>
                ((vector<ODDLParser::DDLNode*,std::allocator<ODDLParser::DDLNode*>> *)&this->m_stack
                 ,__position,&local_8);
    }
    else {
      *__position._M_current = node;
      pppDVar1 = &(this->m_stack).
                  super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppDVar1 = *pppDVar1 + 1;
    }
  }
  return;
}

Assistant:

void OpenDDLParser::pushNode( DDLNode *node ) {
    if( ddl_nullptr == node ) {
        return;
    }

    m_stack.push_back( node );
}